

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

int __thiscall
asl::Array<char>::clone
          (Array<char> *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  char *p;
  int n;
  Array<char> *this_local;
  Array<char> *b;
  
  p = *(char **)__fn;
  n = length((Array<char> *)__fn);
  Array(this,p,n);
  return (int)this;
}

Assistant:

Array clone() const
	{
		Array b(_a, length());
		return b;
	}